

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

JsonParse * jsonParseFuncArg(sqlite3_context *ctx,sqlite3_value *pArg,u32 flgs)

{
  uint uVar1;
  sqlite3 *db;
  int iVar2;
  u32 uVar3;
  u32 uVar4;
  int iVar5;
  void *pvVar6;
  sqlite3_context *pCtx;
  JsonParse *pParse;
  u8 *puVar7;
  uchar *puVar8;
  char *__dest;
  long lVar9;
  byte bVar10;
  ushort uVar11;
  JsonParse *pParse_00;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = pArg->flags & 0x3f;
  if ((0xaaaaaaaaaaaaaaaaU >> uVar11 & 1) != 0) {
LAB_001a281e:
    pParse = (JsonParse *)0x0;
    goto LAB_001a2821;
  }
  if ((0x4000000040004U >> uVar11 & 1) != 0) {
    puVar8 = sqlite3_value_text(pArg);
    if (puVar8 != (uchar *)0x0) {
      iVar5 = sqlite3_value_bytes(pArg);
      pvVar6 = sqlite3_get_auxdata(ctx,-0x68f72);
      uVar14 = 0;
      if (pvVar6 != (void *)0x0) {
        uVar1 = *(uint *)((long)pvVar6 + 8);
        uVar12 = 0;
        if (0 < (int)uVar1) {
          uVar12 = (ulong)uVar1;
        }
        for (; uVar12 != uVar14; uVar14 = uVar14 + 1) {
          if (*(uchar **)(*(long *)((long)pvVar6 + uVar14 * 8 + 0x10) + 0x10) == puVar8)
          goto LAB_001a272c;
        }
        for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
          lVar9 = *(long *)((long)pvVar6 + uVar14 * 8 + 0x10);
          if ((*(int *)(lVar9 + 0x20) == iVar5) &&
             (iVar2 = bcmp(*(void **)(lVar9 + 0x10),puVar8,(long)iVar5), iVar2 == 0))
          goto LAB_001a272c;
        }
      }
    }
    pParse_00 = (JsonParse *)0x0;
    goto LAB_001a251d;
  }
LAB_001a2461:
  pParse_00 = (JsonParse *)0x0;
  goto LAB_001a251d;
LAB_001a272c:
  uVar13 = (uint)uVar14;
  if ((int)uVar1 <= (int)uVar13) goto LAB_001a2461;
  if ((int)uVar13 < (int)(uVar1 - 1)) {
    lVar9 = (uVar14 & 0xffffffff) * 8;
    pParse_00 = *(JsonParse **)((long)pvVar6 + lVar9 + 0x10);
    memmove((void *)((long)pvVar6 + lVar9 + 0x10),
            (void *)((long)pvVar6 + (ulong)(uVar13 + 1) * 8 + 0x10),
            (long)(int)(uVar1 + ~uVar13) << 3);
    *(JsonParse **)((long)pvVar6 + (long)*(int *)((long)pvVar6 + 8) * 8 + 8) = pParse_00;
  }
  else {
    pParse_00 = *(JsonParse **)((long)pvVar6 + (long)(int)uVar13 * 8 + 0x10);
  }
  if (pParse_00 == (JsonParse *)0x0) goto LAB_001a2461;
  pParse_00->nJPRef = pParse_00->nJPRef + 1;
  pParse = pParse_00;
  if ((flgs & 1) == 0) goto LAB_001a2821;
LAB_001a251d:
  db = ctx->pOut->db;
  pCtx = (sqlite3_context *)0x0;
  if ((flgs & 2) == 0) {
    pCtx = ctx;
  }
  do {
    pParse = (JsonParse *)sqlite3DbMallocZero(db,0x48);
    if (pParse == (JsonParse *)0x0) {
LAB_001a2806:
      jsonParseFree(pParse_00);
      jsonParseFree(pParse);
      sqlite3_result_error_nomem(ctx);
      goto LAB_001a281e;
    }
    pParse->zJson = (char *)0x0;
    pParse->db = (sqlite3 *)0x0;
    pParse->nJson = 0;
    pParse->nJPRef = 0;
    pParse->iErr = 0;
    pParse->iDepth = 0;
    pParse->nErr = '\0';
    pParse->oom = '\0';
    pParse->bJsonIsRCStr = '\0';
    pParse->hasNonstd = '\0';
    pParse->bReadOnly = '\0';
    pParse->eEdit = '\0';
    pParse->delta = 0;
    pParse->nIns = 0;
    pParse->iLabel = 0;
    pParse->aIns = (u8 *)0x0;
    pParse->aBlob = (u8 *)0x0;
    pParse->nBlob = 0;
    pParse->nBlobAlloc = 0;
    pParse->db = db;
    pParse->nJPRef = 1;
    if (pParse_00 != (JsonParse *)0x0) {
      uVar1 = pParse_00->nBlob;
      puVar7 = (u8 *)sqlite3DbMallocRaw(db,(ulong)uVar1);
      pParse->aBlob = puVar7;
      if (puVar7 == (u8 *)0x0) goto LAB_001a2806;
      memcpy(puVar7,pParse_00->aBlob,(ulong)uVar1);
      pParse->nBlob = uVar1;
      pParse->nBlobAlloc = uVar1;
      pParse->hasNonstd = pParse_00->hasNonstd;
      jsonParseFree(pParse_00);
      break;
    }
    if ((0x1000000010001U >> (sbyte)uVar11 & 1) != 0) {
      local_3c = 0;
      puVar7 = (u8 *)sqlite3_value_blob(pArg);
      pParse->aBlob = puVar7;
      uVar3 = sqlite3_value_bytes(pArg);
      pParse->nBlob = uVar3;
      if (uVar3 == 0) {
        pParse->aBlob = (u8 *)0x0;
      }
      else if (pParse->aBlob != (byte *)0x0) {
        bVar10 = *pParse->aBlob & 0xf;
        if ((((bVar10 < 0xd) && (uVar4 = jsonbPayloadSize(pParse,0,&local_3c), uVar4 != 0)) &&
            (uVar4 + local_3c == uVar3)) && ((2 < bVar10 || (local_3c == 0)))) {
          if (((flgs & 1) != 0) && (iVar5 = jsonBlobMakeEditable(pParse,0), iVar5 == 0))
          goto LAB_001a2806;
          break;
        }
        pParse->aBlob = (u8 *)0x0;
        pParse->nBlob = 0;
      }
    }
    puVar8 = sqlite3_value_text(pArg);
    pParse->zJson = (char *)puVar8;
    iVar5 = sqlite3_value_bytes(pArg);
    pParse->nJson = iVar5;
    if (db->mallocFailed != '\0') goto LAB_001a2806;
    if (iVar5 == 0) {
      if ((flgs & 2) == 0) {
        jsonParseFree(pParse);
        sqlite3_result_error(ctx,"malformed JSON",-1);
        goto LAB_001a281e;
      }
LAB_001a27c4:
      pParse->nErr = '\x01';
      break;
    }
    iVar5 = jsonConvertTextToBlob(pParse,pCtx);
    if (iVar5 != 0) {
      if ((flgs & 2) != 0) goto LAB_001a27c4;
      jsonParseFree(pParse);
      goto LAB_001a281e;
    }
    if (((pArg == (sqlite3_value *)0x0) ||
        ((pArg->flags >> 0xc & 1) == 0 || (pArg->flags & 0x12) == 0)) ||
       (pArg->xDel != sqlite3RCStrUnref)) {
      __dest = sqlite3RCStrNew((long)pParse->nJson);
      if (__dest == (char *)0x0) goto LAB_001a2806;
      memcpy(__dest,pParse->zJson,(long)pParse->nJson);
      pParse->zJson = __dest;
      __dest[pParse->nJson] = '\0';
    }
    else {
      *(long *)(pParse->zJson + -8) = *(long *)(pParse->zJson + -8) + 1;
    }
    pParse->bJsonIsRCStr = '\x01';
    iVar5 = jsonCacheInsert(ctx,pParse);
    if (iVar5 == 7) goto LAB_001a2806;
    pParse_00 = pParse;
  } while ((flgs & 1) != 0);
LAB_001a2821:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pParse;
}

Assistant:

static JsonParse *jsonParseFuncArg(
  sqlite3_context *ctx,
  sqlite3_value *pArg,
  u32 flgs
){
  int eType;                   /* Datatype of pArg */
  JsonParse *p = 0;            /* Value to be returned */
  JsonParse *pFromCache = 0;   /* Value taken from cache */
  sqlite3 *db;                 /* The database connection */

  assert( ctx!=0 );
  eType = sqlite3_value_type(pArg);
  if( eType==SQLITE_NULL ){
    return 0;
  }
  pFromCache = jsonCacheSearch(ctx, pArg);
  if( pFromCache ){
    pFromCache->nJPRef++;
    if( (flgs & JSON_EDITABLE)==0 ){
      return pFromCache;
    }
  }
  db = sqlite3_context_db_handle(ctx);
rebuild_from_cache:
  p = sqlite3DbMallocZero(db, sizeof(*p));
  if( p==0 ) goto json_pfa_oom;
  memset(p, 0, sizeof(*p));
  p->db = db;
  p->nJPRef = 1;
  if( pFromCache!=0 ){
    u32 nBlob = pFromCache->nBlob;
    p->aBlob = sqlite3DbMallocRaw(db, nBlob);
    if( p->aBlob==0 ) goto json_pfa_oom;
    memcpy(p->aBlob, pFromCache->aBlob, nBlob);
    p->nBlobAlloc = p->nBlob = nBlob;
    p->hasNonstd = pFromCache->hasNonstd;
    jsonParseFree(pFromCache);
    return p;
  }
  if( eType==SQLITE_BLOB ){
    if( jsonArgIsJsonb(pArg,p) ){
      if( (flgs & JSON_EDITABLE)!=0 && jsonBlobMakeEditable(p, 0)==0 ){
        goto json_pfa_oom;
      }
      return p;
    }
    /* If the blob is not valid JSONB, fall through into trying to cast
    ** the blob into text which is then interpreted as JSON.  (tag-20240123-a)
    **
    ** This goes against all historical documentation about how the SQLite
    ** JSON functions were suppose to work.  From the beginning, blob was
    ** reserved for expansion and a blob value should have raised an error.
    ** But it did not, due to a bug.  And many applications came to depend
    ** upon this buggy behavior, espeically when using the CLI and reading
    ** JSON text using readfile(), which returns a blob.  For this reason
    ** we will continue to support the bug moving forward.
    ** See for example https://sqlite.org/forum/forumpost/012136abd5292b8d
    */
  }
  p->zJson = (char*)sqlite3_value_text(pArg);
  p->nJson = sqlite3_value_bytes(pArg);
  if( db->mallocFailed ) goto json_pfa_oom;
  if( p->nJson==0 ) goto json_pfa_malformed;
  assert( p->zJson!=0 );
  if( jsonConvertTextToBlob(p, (flgs & JSON_KEEPERROR) ? 0 : ctx) ){
    if( flgs & JSON_KEEPERROR ){
      p->nErr = 1;
      return p;
    }else{
      jsonParseFree(p);
      return 0;
    }
  }else{
    int isRCStr = sqlite3ValueIsOfClass(pArg, sqlite3RCStrUnref);
    int rc;
    if( !isRCStr ){
      char *zNew = sqlite3RCStrNew( p->nJson );
      if( zNew==0 ) goto json_pfa_oom;
      memcpy(zNew, p->zJson, p->nJson);
      p->zJson = zNew;
      p->zJson[p->nJson] = 0;
    }else{
      sqlite3RCStrRef(p->zJson);
    }
    p->bJsonIsRCStr = 1;
    rc = jsonCacheInsert(ctx, p);
    if( rc==SQLITE_NOMEM ) goto json_pfa_oom;
    if( flgs & JSON_EDITABLE ){
      pFromCache = p;
      p = 0;
      goto rebuild_from_cache;
    }
  }
  return p;

json_pfa_malformed:
  if( flgs & JSON_KEEPERROR ){
    p->nErr = 1;
    return p;
  }else{
    jsonParseFree(p);
    sqlite3_result_error(ctx, "malformed JSON", -1);
    return 0;
  }

json_pfa_oom:
  jsonParseFree(pFromCache);
  jsonParseFree(p);
  sqlite3_result_error_nomem(ctx);
  return 0;
}